

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

string * __thiscall
google::protobuf::MessageLite::InitializationErrorString_abi_cxx11_
          (string *__return_storage_ptr__,MessageLite *this)

{
  int iVar1;
  undefined4 extraout_var;
  ClassDataFull *pCVar2;
  LogMessageFatal local_20;
  ClassData *this_00;
  
  iVar1 = (*this->_vptr_MessageLite[4])(this);
  this_00 = (ClassData *)CONCAT44(extraout_var,iVar1);
  if (this_00 != (ClassData *)0x0) {
    if (this_00->is_lite == false) {
      pCVar2 = internal::ClassData::full(this_00);
      (*pCVar2->descriptor_methods->initialization_error_string)(__return_storage_ptr__,this);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,
                 "(cannot determine missing fields for lite message)",(allocator<char> *)&local_20);
    }
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
             ,0x84,"data != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

std::string MessageLite::InitializationErrorString() const {
  auto* data = GetClassData();
  ABSL_DCHECK(data != nullptr);

  if (!data->is_lite) {
    // For !LITE messages, we use the descriptor method function.
    return data->full().descriptor_methods->initialization_error_string(*this);
  }

  return "(cannot determine missing fields for lite message)";
}